

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

uint32_t __thiscall
spirv_cross::CompilerMSL::get_declared_type_alignment_msl
          (CompilerMSL *this,SPIRType *type,bool is_packed,bool row_major)

{
  CompilerError *this_00;
  uint32_t uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  
  if ((type->pointer == true) && (type->storage == StorageClassPhysicalStorageBuffer)) {
    return 8;
  }
  switch(type->basetype) {
  case Unknown:
  case Void:
  case AtomicCounter:
  case Image:
  case SampledImage:
  case Sampler:
    this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(this_00,"Querying alignment of opaque object.");
    break;
  default:
switchD_0023798b_caseD_2:
    if (is_packed) {
      uVar1 = type->width >> 3;
    }
    else {
      uVar3 = type->columns;
      if (type->columns < 2) {
        uVar3 = type->vecsize;
      }
      if (!row_major) {
        uVar3 = type->vecsize;
      }
      uVar2 = 4;
      if (uVar3 != 3) {
        uVar2 = uVar3;
      }
      uVar1 = uVar2 * (type->width >> 3);
    }
    return uVar1;
  case Int64:
    if (0x4f4b < (this->msl_options).msl_version) goto switchD_0023798b_caseD_2;
    this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError
              (this_00,"long types in buffers are only supported in MSL 2.3 and above.");
    break;
  case UInt64:
    if (0x4f4b < (this->msl_options).msl_version) goto switchD_0023798b_caseD_2;
    this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError
              (this_00,"ulong types in buffers are only supported in MSL 2.3 and above.");
    break;
  case Double:
    this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(this_00,"double types are not supported in buffers in MSL.");
    break;
  case Struct:
    if ((type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
        buffer_size != 0) {
      uVar3 = 1;
      uVar4 = 0;
      do {
        uVar1 = get_declared_struct_member_alignment_msl(this,type,(uint32_t)uVar4);
        if (uVar3 <= uVar1) {
          uVar3 = uVar1;
        }
        uVar4 = (ulong)((uint32_t)uVar4 + 1);
      } while (uVar4 < (type->member_types).
                       super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size);
      return uVar3;
    }
    return 1;
  }
  __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

uint32_t CompilerMSL::get_declared_type_alignment_msl(const SPIRType &type, bool is_packed, bool row_major) const
{
	// Pointers align on multiples of 8 bytes.
	// Deliberately ignore array-ness here. It's not relevant for alignment.
	if (type.pointer && type.storage == StorageClassPhysicalStorageBuffer)
		return 8;

	switch (type.basetype)
	{
	case SPIRType::Unknown:
	case SPIRType::Void:
	case SPIRType::AtomicCounter:
	case SPIRType::Image:
	case SPIRType::SampledImage:
	case SPIRType::Sampler:
		SPIRV_CROSS_THROW("Querying alignment of opaque object.");

	case SPIRType::Double:
		SPIRV_CROSS_THROW("double types are not supported in buffers in MSL.");

	case SPIRType::Struct:
	{
		// In MSL, a struct's alignment is equal to the maximum alignment of any of its members.
		uint32_t alignment = 1;
		for (uint32_t i = 0; i < type.member_types.size(); i++)
			alignment = max(alignment, uint32_t(get_declared_struct_member_alignment_msl(type, i)));
		return alignment;
	}

	default:
	{
		if (type.basetype == SPIRType::Int64 && !msl_options.supports_msl_version(2, 3))
			SPIRV_CROSS_THROW("long types in buffers are only supported in MSL 2.3 and above.");
		if (type.basetype == SPIRType::UInt64 && !msl_options.supports_msl_version(2, 3))
			SPIRV_CROSS_THROW("ulong types in buffers are only supported in MSL 2.3 and above.");
		// Alignment of packed type is the same as the underlying component or column size.
		// Alignment of unpacked type is the same as the vector size.
		// Alignment of 3-elements vector is the same as 4-elements (including packed using column).
		if (is_packed)
		{
			// If we have packed_T and friends, the alignment is always scalar.
			return type.width / 8;
		}
		else
		{
			// This is the general rule for MSL. Size == alignment.
			uint32_t vecsize = (row_major && type.columns > 1) ? type.columns : type.vecsize;
			return (type.width / 8) * (vecsize == 3 ? 4 : vecsize);
		}
	}
	}
}